

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LDLt(TPZMatrix<std::complex<long_double>_> *this)

{
  byte bVar1;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r_1;
  complex<long_double> __r_3;
  complex<long_double> tmp;
  undefined4 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  undefined2 uVar13;
  complex<long_double> local_168;
  longdouble local_140;
  longdouble local_134;
  complex<long_double> local_128;
  complex<long_double> local_108;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  longdouble local_c4;
  undefined1 local_b8 [32];
  complex<long_double> local_98;
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar4 = (this->super_TPZBaseMatrix).fRow;
  if (lVar4 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar4 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar4) {
    uVar5 = (ulong)((uint)lVar4 & 0x7fffffff);
    local_e0 = 1;
    local_c4 = (longdouble)1e-16;
    uVar3 = 0;
    local_d0 = uVar5;
    do {
      local_140 = (longdouble)0;
      local_134 = local_140;
      lVar6 = in_ST0;
      lVar7 = in_ST1;
      lVar8 = in_ST2;
      lVar9 = in_ST3;
      if (uVar3 != 0) {
        uVar2 = 0;
        local_140 = (longdouble)0;
        local_134 = local_140;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_128,this,uVar2,uVar2);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_b8,this,uVar2,uVar3);
          local_98._M_value._0_8_ = SUB108(local_b8._0_10_,0);
          local_98._M_value._8_2_ = SUB102(local_b8._0_10_,8);
          local_98._M_value._16_8_ = SUB108(-(longdouble)local_b8._16_10_,0);
          local_98._M_value._24_2_ = SUB102((unkuint10)-(longdouble)local_b8._16_10_ >> 0x40,0);
          local_108._M_value._0_4_ = local_128._M_value._0_4_;
          local_108._M_value._4_4_ = local_128._M_value._4_4_;
          local_108._M_value._8_2_ = local_128._M_value._8_2_;
          local_108._M_value._10_2_ = local_128._M_value._10_2_;
          local_108._M_value._12_4_ =
               SUB84(CONCAT26(local_128._M_value._14_2_,
                              CONCAT42(local_128._M_value._10_4_,local_128._M_value._8_2_)) >> 0x20,
                     0);
          local_108._M_value._16_4_ = local_128._M_value._16_4_;
          local_108._M_value._20_4_ = local_128._M_value._20_4_;
          local_108._M_value._24_2_ = local_128._M_value._24_2_;
          local_108._M_value._26_2_ = local_128._M_value._26_2_;
          local_108._M_value._28_4_ =
               SUB84(CONCAT26(local_128._M_value._30_2_,
                              CONCAT42(local_128._M_value._26_4_,local_128._M_value._24_2_)) >> 0x20
                     ,0);
          std::complex<long_double>::operator*=(&local_108,&local_98);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((complex<long_double> *)local_78,this,uVar2,uVar3);
          local_168._M_value._16_4_ = local_108._M_value._16_4_;
          local_168._M_value._20_4_ = local_108._M_value._20_4_;
          local_168._M_value._24_2_ = local_108._M_value._24_2_;
          local_168._M_value._26_2_ = local_108._M_value._26_2_;
          local_168._M_value._28_2_ = local_108._M_value._28_2_;
          local_168._M_value._30_2_ = local_108._M_value._30_2_;
          local_168._M_value._0_4_ = local_108._M_value._0_4_;
          local_168._M_value._4_4_ = local_108._M_value._4_4_;
          local_168._M_value._8_2_ = local_108._M_value._8_2_;
          local_168._M_value._10_2_ = local_108._M_value._10_2_;
          local_168._M_value._12_2_ = local_108._M_value._12_2_;
          local_168._M_value._14_2_ = local_108._M_value._14_2_;
          std::complex<long_double>::operator*=(&local_168,(complex<long_double> *)local_78);
          local_140 = (longdouble)
                      CONCAT28(local_168._M_value._8_2_,
                               CONCAT44(local_168._M_value._4_4_,local_168._M_value._0_4_)) +
                      local_140;
          local_134 = (longdouble)
                      CONCAT28(local_168._M_value._24_2_,
                               CONCAT44(local_168._M_value._20_4_,local_168._M_value._16_4_)) +
                      local_134;
          uVar2 = uVar2 + 1;
          lVar7 = in_ST1;
          lVar8 = in_ST2;
          lVar9 = in_ST3;
        } while (uVar3 != uVar2);
      }
      in_ST3 = in_ST4;
      in_ST2 = lVar9;
      in_ST1 = lVar8;
      in_ST0 = lVar7;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_108,this,uVar3,uVar3);
      local_168._M_value._10_2_ = local_108._M_value._10_2_;
      local_168._M_value._12_2_ = local_108._M_value._12_2_;
      local_168._M_value._14_2_ = local_108._M_value._14_2_;
      local_168._M_value._26_2_ = local_108._M_value._26_2_;
      local_168._M_value._28_2_ = local_108._M_value._28_2_;
      local_168._M_value._30_2_ = local_108._M_value._30_2_;
      lVar7 = (longdouble)
              CONCAT28(local_108._M_value._8_2_,
                       CONCAT44(local_108._M_value._4_4_,local_108._M_value._0_4_)) - local_140;
      lVar8 = (longdouble)
              CONCAT28(local_108._M_value._24_2_,
                       CONCAT44(local_108._M_value._20_4_,local_108._M_value._16_4_)) - local_134;
      local_168._M_value._0_4_ = SUB104(lVar7,0);
      local_168._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
      local_168._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
      local_168._M_value._16_4_ = SUB104(lVar8,0);
      local_168._M_value._20_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
      local_168._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
      in_ST4 = in_ST3;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar3,uVar3,&local_168);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_108,this,uVar3,uVar3);
      local_168._M_value._0_4_ = local_108._M_value._0_4_;
      local_168._M_value._4_4_ = local_108._M_value._4_4_;
      local_168._M_value._8_2_ = local_108._M_value._8_2_;
      local_168._M_value._16_4_ = local_108._M_value._16_4_;
      local_168._M_value._20_4_ = local_108._M_value._20_4_;
      local_168._M_value._24_2_ = local_108._M_value._24_2_;
      uVar10 = local_108._M_value._0_4_;
      uVar11 = local_108._M_value._8_2_;
      uVar12 = local_108._M_value._16_4_;
      uVar13 = local_108._M_value._24_2_;
      cabsl();
      if (ABS(lVar6) < local_c4) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_d8 = uVar3 + 1;
      uVar2 = local_e0;
      if (local_d8 < uVar5) {
        do {
          local_140 = (longdouble)0;
          local_134 = local_140;
          lVar6 = in_ST0;
          lVar7 = in_ST1;
          if (uVar3 != 0) {
            uVar5 = 0;
            local_140 = (longdouble)0;
            local_134 = local_140;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_98,this,uVar5,uVar5,in_R8,in_R9,uVar10,uVar11,uVar12,uVar13);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_78,this,uVar3,uVar5);
              local_b8._16_10_ = -(longdouble)local_78._16_10_;
              local_b8._0_10_ = local_78._0_10_;
              local_128._M_value._0_8_ = local_98._M_value._0_8_;
              local_128._M_value._8_2_ = local_98._M_value._8_2_;
              local_128._M_value._10_4_ = local_98._M_value._10_4_;
              local_128._M_value._14_2_ = local_98._M_value._14_2_;
              local_128._M_value._16_8_ = local_98._M_value._16_8_;
              local_128._M_value._24_2_ = local_98._M_value._24_2_;
              local_128._M_value._26_4_ = local_98._M_value._26_4_;
              local_128._M_value._30_2_ = local_98._M_value._30_2_;
              std::complex<long_double>::operator*=(&local_128,(complex<long_double> *)local_b8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_58,this,uVar2,uVar5);
              local_168._M_value._16_4_ = local_128._M_value._16_4_;
              local_168._M_value._20_4_ = local_128._M_value._20_4_;
              local_168._M_value._24_2_ = local_128._M_value._24_2_;
              local_168._M_value._26_2_ = local_128._M_value._26_2_;
              local_168._M_value._28_2_ = local_128._M_value._28_2_;
              local_168._M_value._30_2_ = local_128._M_value._30_2_;
              local_168._M_value._0_4_ = local_128._M_value._0_4_;
              local_168._M_value._4_4_ = local_128._M_value._4_4_;
              local_168._M_value._8_2_ = local_128._M_value._8_2_;
              local_168._M_value._10_2_ = local_128._M_value._10_2_;
              local_168._M_value._12_2_ = local_128._M_value._12_2_;
              local_168._M_value._14_2_ = local_128._M_value._14_2_;
              std::complex<long_double>::operator*=(&local_168,&local_58);
              local_140 = (longdouble)
                          CONCAT28(local_168._M_value._8_2_,
                                   CONCAT44(local_168._M_value._4_4_,local_168._M_value._0_4_)) +
                          local_140;
              local_134 = (longdouble)
                          CONCAT28(local_168._M_value._24_2_,
                                   CONCAT44(local_168._M_value._20_4_,local_168._M_value._16_4_)) +
                          local_134;
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
          in_ST1 = in_ST3;
          in_ST0 = in_ST2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_128,this,uVar2,uVar3);
          lVar8 = (longdouble)CONCAT28(local_128._M_value._8_2_,local_128._M_value._0_8_) -
                  local_140;
          local_168._M_value._14_2_ = local_128._M_value._14_2_;
          local_168._M_value._10_2_ = local_128._M_value._10_2_;
          local_168._M_value._12_2_ = local_128._M_value._12_2_;
          lVar9 = (longdouble)CONCAT28(local_128._M_value._24_2_,local_128._M_value._16_8_) -
                  local_134;
          local_168._M_value._30_2_ = local_128._M_value._30_2_;
          local_168._M_value._26_2_ = local_128._M_value._26_2_;
          local_168._M_value._28_2_ = local_128._M_value._28_2_;
          local_168._M_value._0_4_ = SUB104(lVar8,0);
          local_168._M_value._4_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
          local_168._M_value._8_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
          local_168._M_value._16_4_ = SUB104(lVar9,0);
          local_168._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
          local_168._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
          in_ST2 = in_ST1;
          in_ST3 = in_ST1;
          in_ST4 = in_ST1;
          uVar10 = local_168._M_value._0_4_;
          uVar11 = local_168._M_value._8_2_;
          uVar12 = local_168._M_value._16_4_;
          uVar13 = local_168._M_value._24_2_;
          __divxc3();
          local_168._M_value._0_4_ = SUB104(lVar6,0);
          local_168._M_value._4_4_ = SUB104((unkuint10)lVar6 >> 0x20,0);
          local_168._M_value._8_2_ = SUB102((unkuint10)lVar6 >> 0x40,0);
          local_168._M_value._16_4_ = SUB104(lVar7,0);
          local_168._M_value._20_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
          local_168._M_value._24_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar2,uVar3,&local_168);
          lVar6 = -(longdouble)
                   CONCAT28(local_168._M_value._24_2_,
                            CONCAT44(local_168._M_value._20_4_,local_168._M_value._16_4_));
          local_168._M_value._16_4_ = SUB104(lVar6,0);
          local_168._M_value._20_4_ = SUB104((unkuint10)lVar6 >> 0x20,0);
          local_168._M_value._24_2_ = SUB102((unkuint10)lVar6 >> 0x40,0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar3,uVar2,&local_168);
          uVar2 = uVar2 + 1;
          uVar5 = local_d0;
        } while (uVar2 != local_d0);
      }
      local_e0 = local_e0 + 1;
      uVar3 = local_d8;
    } while (local_d8 != uVar5);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}